

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O3

void __thiscall
xs::ExecutionRequestHandler::processMessage
          (ExecutionRequestHandler *this,MessageType type,deUint8 *data,size_t dataSize)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  TestDriver *pTVar4;
  deUint64 dVar5;
  runtime_error *prVar6;
  StopExecutionMessage msg;
  HelloMessage msg_4;
  ExecuteBinaryMessage local_e0;
  HelloMessage local_50;
  _func_int *local_40 [2];
  
  if ((int)type < 0x66) {
    if (type == MESSAGETYPE_HELLO) {
      HelloMessage::HelloMessage(&local_50,data,dataSize);
      printf("HelloMessage: version = %d\n",(ulong)(uint)local_50.super_Message._12_4_);
      if (local_50.super_Message._12_4_ != 0x12) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_e0.super_Message._vptr_Message = (_func_int **)&local_e0.name;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Unsupported protocol version","");
        std::runtime_error::runtime_error(prVar6,(string *)&local_e0);
        *(undefined ***)prVar6 = &PTR__runtime_error_0012a518;
        __cxa_throw(prVar6,&ProtocolError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (type != MESSAGETYPE_TEST) {
LAB_00111d23:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_e0.super_Message._vptr_Message = (_func_int **)&local_e0.name;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Unsupported message","");
        std::runtime_error::runtime_error(prVar6,(string *)&local_e0);
        *(undefined ***)prVar6 = &PTR__runtime_error_0012a518;
        __cxa_throw(prVar6,&ProtocolError::typeinfo,std::runtime_error::~runtime_error);
      }
      TestMessage::TestMessage((TestMessage *)&local_e0,data,dataSize);
      printf("TestMessage: \'%s\'\n",local_e0.name._M_dataplus._M_p);
      local_e0.super_Message._vptr_Message = (_func_int **)&PTR__TestMessage_0012a7b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.name._M_dataplus._M_p != &local_e0.name.field_2) {
        operator_delete(local_e0.name._M_dataplus._M_p,
                        local_e0.name.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (type == MESSAGETYPE_KEEPALIVE) {
    SimpleMessage<102>::SimpleMessage((SimpleMessage<102> *)&local_e0,data,dataSize);
    puts("KeepAliveMessage");
    dVar5 = deGetMicroseconds();
    this->m_lastKeepAliveReceived = dVar5;
  }
  else if (type == MESSAGETYPE_EXECUTE_BINARY) {
    ExecuteBinaryMessage::ExecuteBinaryMessage(&local_e0,data,dataSize);
    _Var3._M_p = local_e0.workDir._M_dataplus._M_p;
    _Var2._M_p = local_e0.params._M_dataplus._M_p;
    _Var1._M_p = local_e0.name._M_dataplus._M_p;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_e0.caseList);
    printf("ExecuteBinaryMessage: \'%s\', \'%s\', \'%s\', \'%s\'\n",_Var1._M_p,_Var2._M_p,_Var3._M_p
           ,local_50.super_Message._vptr_Message);
    if (local_50.super_Message._vptr_Message != local_40) {
      operator_delete(local_50.super_Message._vptr_Message,(ulong)(local_40[0] + 1));
    }
    pTVar4 = this->m_testDriver;
    if (pTVar4 == (TestDriver *)0x0) {
      pTVar4 = ExecutionServer::acquireTestDriver(this->m_execServer);
      this->m_testDriver = pTVar4;
      TestDriver::reset(pTVar4);
      pTVar4 = this->m_testDriver;
    }
    TestDriver::startProcess
              (pTVar4,local_e0.name._M_dataplus._M_p,local_e0.params._M_dataplus._M_p,
               local_e0.workDir._M_dataplus._M_p,local_e0.caseList._M_dataplus._M_p);
    dVar5 = deGetMicroseconds();
    this->m_lastKeepAliveReceived = dVar5;
    ExecuteBinaryMessage::~ExecuteBinaryMessage(&local_e0);
  }
  else {
    if (type != MESSAGETYPE_STOP_EXECUTION) goto LAB_00111d23;
    SimpleMessage<112>::SimpleMessage((SimpleMessage<112> *)&local_e0,data,dataSize);
    puts("StopExecutionMessage");
    pTVar4 = this->m_testDriver;
    if (pTVar4 == (TestDriver *)0x0) {
      pTVar4 = ExecutionServer::acquireTestDriver(this->m_execServer);
      this->m_testDriver = pTVar4;
      TestDriver::reset(pTVar4);
      pTVar4 = this->m_testDriver;
    }
    TestDriver::stopProcess(pTVar4);
  }
  return;
}

Assistant:

void ExecutionRequestHandler::processMessage (MessageType type, const deUint8* data, size_t dataSize)
{
	switch (type)
	{
		case MESSAGETYPE_HELLO:
		{
			HelloMessage msg(data, dataSize);
			DBG_PRINT(("HelloMessage: version = %d\n", msg.version));
			if (msg.version != PROTOCOL_VERSION)
				throw ProtocolError("Unsupported protocol version");
			break;
		}

		case MESSAGETYPE_TEST:
		{
			TestMessage msg(data, dataSize);
			DBG_PRINT(("TestMessage: '%s'\n", msg.test.c_str()));
			break;
		}

		case MESSAGETYPE_KEEPALIVE:
		{
			KeepAliveMessage msg(data, dataSize);
			DBG_PRINT(("KeepAliveMessage\n"));
			keepAliveReceived();
			break;
		}

		case MESSAGETYPE_EXECUTE_BINARY:
		{
			ExecuteBinaryMessage msg(data, dataSize);
			DBG_PRINT(("ExecuteBinaryMessage: '%s', '%s', '%s', '%s'\n", msg.name.c_str(), msg.params.c_str(), msg.workDir.c_str(), msg.caseList.substr(0, 10).c_str()));
			getTestDriver()->startProcess(msg.name.c_str(), msg.params.c_str(), msg.workDir.c_str(), msg.caseList.c_str());
			keepAliveReceived(); // \todo [2011-10-11 pyry] Remove this once Candy is fixed.
			break;
		}

		case MESSAGETYPE_STOP_EXECUTION:
		{
			StopExecutionMessage msg(data, dataSize);
			DBG_PRINT(("StopExecutionMessage\n"));
			getTestDriver()->stopProcess();
			break;
		}

		default:
			throw ProtocolError("Unsupported message");
	}
}